

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O3

Quat4f __thiscall Quat4f::normalized(Quat4f *this)

{
  undefined1 auVar1 [16];
  Quat4f *q;
  float *in_RDI;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  Quat4f QVar7;
  
  auVar1 = *(undefined1 (*) [16])this->m_elements;
  fVar2 = auVar1._0_4_;
  fVar3 = auVar1._4_4_;
  QVar7.m_elements._0_8_ = auVar1._0_8_;
  fVar4 = auVar1._8_4_;
  fVar5 = auVar1._12_4_;
  QVar7.m_elements[2] = SQRT(fVar5 * fVar5 + fVar4 * fVar4 + fVar2 * fVar2 + fVar3 * fVar3);
  fVar6 = 1.0 / QVar7.m_elements[2];
  *in_RDI = fVar6 * fVar2;
  in_RDI[1] = fVar6 * fVar3;
  in_RDI[2] = fVar6 * fVar4;
  in_RDI[3] = fVar6 * fVar5;
  QVar7.m_elements[3] = 0.0;
  return (Quat4f)QVar7.m_elements;
}

Assistant:

Quat4f Quat4f::normalized() const
{
	Quat4f q( *this );
	q.normalize();
	return q;
}